

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void DThinker::RunThinkers(void)

{
  int iVar1;
  int local_10;
  int local_c;
  int count;
  int i;
  
  cycle_t::Reset(&ThinkCycles);
  cycle_t::Reset(&BotSupportCycles);
  cycle_t::Reset(&ActionCycles);
  BotWTG = 0;
  cycle_t::Clock(&ThinkCycles);
  for (local_c = 0x20; local_c < 0x80; local_c = local_c + 1) {
    TickThinkers(Thinkers + local_c,(FThinkerList *)0x0);
  }
  do {
    local_10 = 0;
    for (local_c = 0x20; local_c < 0x80; local_c = local_c + 1) {
      iVar1 = TickThinkers(FreshThinkers + local_c,Thinkers + local_c);
      local_10 = iVar1 + local_10;
    }
  } while (local_10 != 0);
  cycle_t::Unclock(&ThinkCycles);
  return;
}

Assistant:

void DThinker::RunThinkers ()
{
	int i, count;

	ThinkCycles.Reset();
	BotSupportCycles.Reset();
	ActionCycles.Reset();
	BotWTG = 0;

	ThinkCycles.Clock();

	// Tick every thinker left from last time
	for (i = STAT_FIRST_THINKING; i <= MAX_STATNUM; ++i)
	{
		TickThinkers (&Thinkers[i], NULL);
	}

	// Keep ticking the fresh thinkers until there are no new ones.
	do
	{
		count = 0;
		for (i = STAT_FIRST_THINKING; i <= MAX_STATNUM; ++i)
		{
			count += TickThinkers (&FreshThinkers[i], &Thinkers[i]);
		}
	} while (count != 0);

	ThinkCycles.Unclock();
}